

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O3

void __thiscall Memory::HeapInfo::ScanNewImplicitRoots(HeapInfo *this)

{
  SmallHeapBlockT<SmallAllocationBlockAttributes> *pSVar1;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *pSVar2;
  SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *this_00;
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *pSVar3;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *this_01;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *this_02;
  SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *this_03;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *pSVar4;
  SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *this_04;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this_05;
  SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *heapBlock;
  long lVar5;
  
  lVar5 = 0x78;
  do {
    HeapBucketGroup<SmallAllocationBlockAttributes>::ScanNewImplicitRoots
              ((HeapBucketGroup<SmallAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar5),this->recycler);
    lVar5 = lVar5 + 0x380;
  } while (lVar5 != 0xa878);
  lVar5 = 0xa878;
  do {
    HeapBucketGroup<MediumAllocationBlockAttributes>::ScanNewImplicitRoots
              ((HeapBucketGroup<MediumAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar5),this->recycler);
    lVar5 = lVar5 + 0x380;
  } while (lVar5 != 0x10df8);
  LargeHeapBucket::ScanNewImplicitRoots(&this->largeObjectBucket,this->recycler);
  this_00 = this->newLeafHeapBlockList;
  while (this_00 != (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    SmallLeafHeapBlockT<SmallAllocationBlockAttributes>::ScanNewImplicitRoots
              (this_00,this->recycler);
    pSVar1 = (this_00->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
    this_00 = HeapBlock::AsLeafBlock<SmallAllocationBlockAttributes>(&pSVar1->super_HeapBlock);
  }
  pSVar3 = this->newNormalHeapBlockList;
  while (pSVar3 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanNewImplicitRoots
              (pSVar3,this->recycler);
    pSVar1 = (pSVar3->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
    pSVar3 = HeapBlock::AsNormalBlock<SmallAllocationBlockAttributes>(&pSVar1->super_HeapBlock);
  }
  pSVar3 = &this->newNormalWithBarrierHeapBlockList->
            super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>;
  while (pSVar3 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanNewImplicitRoots
              (pSVar3,this->recycler);
    pSVar1 = (pSVar3->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
    pSVar3 = &HeapBlock::AsNormalWriteBarrierBlock<SmallAllocationBlockAttributes>
                        (&pSVar1->super_HeapBlock)->
              super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>;
  }
  this_01 = this->newFinalizableWithBarrierHeapBlockList;
  while (this_01 != (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanNewImplicitRoots
              ((SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)this_01,this->recycler);
    pSVar1 = (this_01->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>).
             super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>.
             super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
    this_01 = HeapBlock::AsFinalizableWriteBarrierBlock<SmallAllocationBlockAttributes>
                        (&pSVar1->super_HeapBlock);
  }
  this_02 = this->newFinalizableHeapBlockList;
  while (this_02 != (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanNewImplicitRoots
              (&this_02->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>,this->recycler)
    ;
    pSVar1 = (this_02->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
             super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
    this_02 = HeapBlock::AsFinalizableBlock<SmallAllocationBlockAttributes>
                        (&pSVar1->super_HeapBlock);
  }
  this_03 = this->newMediumLeafHeapBlockList;
  while (this_03 != (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    SmallLeafHeapBlockT<MediumAllocationBlockAttributes>::ScanNewImplicitRoots
              (this_03,this->recycler);
    pSVar2 = (this_03->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).next;
    if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
    this_03 = HeapBlock::AsLeafBlock<MediumAllocationBlockAttributes>(&pSVar2->super_HeapBlock);
  }
  pSVar4 = this->newMediumNormalHeapBlockList;
  while (pSVar4 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::ScanNewImplicitRoots
              (pSVar4,this->recycler);
    pSVar2 = (pSVar4->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).next;
    if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
    pSVar4 = HeapBlock::AsNormalBlock<MediumAllocationBlockAttributes>(&pSVar2->super_HeapBlock);
  }
  pSVar4 = &this->newMediumNormalWithBarrierHeapBlockList->
            super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>;
  while (pSVar4 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::ScanNewImplicitRoots
              (pSVar4,this->recycler);
    pSVar2 = (pSVar4->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).next;
    if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
    pSVar4 = &HeapBlock::AsNormalWriteBarrierBlock<MediumAllocationBlockAttributes>
                        (&pSVar2->super_HeapBlock)->
              super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>;
  }
  this_04 = this->newMediumFinalizableWithBarrierHeapBlockList;
  while (this_04 != (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::ScanNewImplicitRoots
              ((SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)this_04,this->recycler);
    pSVar2 = (this_04->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
             super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
             super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
    if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
    this_04 = HeapBlock::AsFinalizableWriteBarrierBlock<MediumAllocationBlockAttributes>
                        (&pSVar2->super_HeapBlock);
  }
  this_05 = this->newMediumFinalizableHeapBlockList;
  while( true ) {
    if (this_05 == (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      return;
    }
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::ScanNewImplicitRoots
              (&this_05->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>,this->recycler
              );
    pSVar2 = (this_05->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
             super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
    if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
    this_05 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>
                        (&pSVar2->super_HeapBlock);
  }
  return;
}

Assistant:

void
HeapInfo::ScanNewImplicitRoots()
{
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].ScanNewImplicitRoots(recycler);
    }
#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].ScanNewImplicitRoots(recycler);
    }
#endif

    largeObjectBucket.ScanNewImplicitRoots(recycler);

#if ENABLE_CONCURRENT_GC

    // NOTE: need to do newLeafHeapBlockList to find new memory
    HeapBlockList::ForEach(newLeafHeapBlockList, [this](SmallLeafHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

    HeapBlockList::ForEach(newNormalHeapBlockList, [this](SmallNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

#ifdef RECYCLER_WRITE_BARRIER
    HeapBlockList::ForEach(newNormalWithBarrierHeapBlockList, [this](SmallNormalWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

    HeapBlockList::ForEach(newFinalizableWithBarrierHeapBlockList, [this](SmallFinalizableWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });
#endif

    HeapBlockList::ForEach(newFinalizableHeapBlockList, [this](SmallNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

    // NOTE: need to do newLeafHeapBlockList to find new memory
    HeapBlockList::ForEach(newMediumLeafHeapBlockList, [this](MediumLeafHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

    HeapBlockList::ForEach(newMediumNormalHeapBlockList, [this](MediumNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

#ifdef RECYCLER_WRITE_BARRIER
    HeapBlockList::ForEach(newMediumNormalWithBarrierHeapBlockList, [this](MediumNormalWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

    HeapBlockList::ForEach(newMediumFinalizableWithBarrierHeapBlockList, [this](MediumFinalizableWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });
#endif

    HeapBlockList::ForEach(newMediumFinalizableHeapBlockList, [this](MediumNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

#endif
}